

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

void __thiscall DPSprite::DPSprite(DPSprite *this,player_t *owner,AActor *caller,int id)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar3;
  DPSprite *pDVar4;
  DPSprite *pointing;
  DObject *pDVar5;
  bool bVar6;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_00700808;
  this->x = 0.0;
  this->y = 0.0;
  this->oldx = 0.0;
  this->oldy = 0.0;
  this->firstTic = true;
  this->Flags = 0;
  (this->Caller).field_0.p = caller;
  this->Owner = owner;
  this->Sprite = 0;
  this->ID = id;
  this->processPending = true;
  pDVar4 = (owner->psprites).field_0.p;
  if ((pDVar4 != (DPSprite *)0x0) && (((pDVar4->super_DObject).ObjectFlags & 0x20) != 0)) {
    (owner->psprites).field_0.p = (DPSprite *)0x0;
    pDVar4 = (DPSprite *)0x0;
  }
  bVar6 = pDVar4 == (DPSprite *)0x0;
  if (bVar6) {
    pointing = (DPSprite *)0x0;
    pDVar4 = (DPSprite *)0x0;
LAB_00438d83:
    (this->Next).field_0.p = pDVar4;
  }
  else {
    if (pDVar4->ID < id) {
      do {
        pointing = pDVar4;
        pDVar4 = (pointing->Next).field_0.p;
        if ((pDVar4 != (DPSprite *)0x0) && (((pDVar4->super_DObject).ObjectFlags & 0x20) != 0)) {
          (pointing->Next).field_0.p = (DPSprite *)0x0;
          pDVar4 = (DPSprite *)0x0;
        }
        bVar6 = pDVar4 == (DPSprite *)0x0;
        if (bVar6) goto LAB_00438d83;
      } while (pDVar4->ID < id);
    }
    else {
      pointing = (DPSprite *)0x0;
    }
    (this->Next).field_0.p = pDVar4;
    if (((!bVar6) && (((pDVar4->super_DObject).ObjectFlags & 3) != 0)) &&
       (((this->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&this->super_DObject,&pDVar4->super_DObject);
    }
  }
  if (pointing == (DPSprite *)0x0) {
    (this->Owner->psprites).field_0.p = this;
    if ((GC::State == 1) && (((this->super_DObject).ObjectFlags & 3) != 0)) {
      GC::Barrier((DObject *)0x0,&this->super_DObject);
    }
  }
  else {
    (pointing->Next).field_0.p = this;
    if ((((this->super_DObject).ObjectFlags & 3) != 0) &&
       (((pointing->super_DObject).ObjectFlags & 4) != 0)) {
      GC::Barrier(&pointing->super_DObject,&this->super_DObject);
    }
  }
  pDVar4 = (this->Next).field_0.p;
  if (pDVar4 != (DPSprite *)0x0) {
    if (((pDVar4->super_DObject).ObjectFlags & 0x20) == 0) {
      if (this->ID != 0 && ((this->Next).field_0.p)->ID == this->ID) {
        (*(((this->Next).field_0.p)->super_DObject)._vptr_DObject[4])();
      }
    }
    else {
      (this->Next).field_0.p = (DPSprite *)0x0;
    }
  }
  pDVar5 = (this->Caller).field_0.o;
  if ((pDVar5 != (DObject *)0x0) && ((pDVar5->ObjectFlags & 0x20) != 0)) {
    (this->Caller).field_0.p = (AActor *)0x0;
    pDVar5 = (DObject *)0x0;
  }
  pPVar1 = AWeapon::RegistrationInfo.MyClass;
  if (pDVar5->Class == (PClass *)0x0) {
    iVar2 = (**pDVar5->_vptr_DObject)(pDVar5);
    pDVar5->Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pPVar3 = pDVar5->Class;
  bVar6 = pPVar3 != (PClass *)0x0;
  if (pPVar3 != pPVar1 && bVar6) {
    do {
      pPVar3 = pPVar3->ParentClass;
      bVar6 = pPVar3 != (PClass *)0x0;
      if (pPVar3 == pPVar1) break;
    } while (pPVar3 != (PClass *)0x0);
  }
  if (!bVar6) {
    pDVar5 = (this->Caller).field_0.o;
    if ((pDVar5 != (DObject *)0x0) && ((pDVar5->ObjectFlags & 0x20) != 0)) {
      (this->Caller).field_0.p = (AActor *)0x0;
      pDVar5 = (DObject *)0x0;
    }
    pPVar1 = APlayerPawn::RegistrationInfo.MyClass;
    if (pDVar5->Class == (PClass *)0x0) {
      iVar2 = (**pDVar5->_vptr_DObject)(pDVar5);
      pDVar5->Class = (PClass *)CONCAT44(extraout_var_00,iVar2);
    }
    pPVar3 = pDVar5->Class;
    bVar6 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar6) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar6 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar6) {
      return;
    }
  }
  this->Flags = 0xf;
  return;
}

Assistant:

DPSprite::DPSprite(player_t *owner, AActor *caller, int id)
: x(.0), y(.0),
  oldx(.0), oldy(.0),
  firstTic(true),
  Sprite(0),
  Flags(0),
  Caller(caller),
  Owner(owner),
  ID(id),
  processPending(true)
{
	DPSprite *prev = nullptr;
	DPSprite *next = Owner->psprites;
	while (next != nullptr && next->ID < ID)
	{
		prev = next;
		next = next->Next;
	}
	Next = next;
	GC::WriteBarrier(this, next);
	if (prev == nullptr)
	{
		Owner->psprites = this;
		GC::WriteBarrier(this);
	}
	else
	{
		prev->Next = this;
		GC::WriteBarrier(prev, this);
	}

	if (Next && Next->ID == ID && ID != 0)
		Next->Destroy(); // Replace it.

	if (Caller->IsKindOf(RUNTIME_CLASS(AWeapon)) || Caller->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
		Flags = (PSPF_ADDWEAPON|PSPF_ADDBOB|PSPF_POWDOUBLE|PSPF_CVARFAST);
}